

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManPlaceDfs_rec(Frc_Man_t *p,Frc_Obj_t *pObj,int *piPlace)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = pObj->iFanout;
  if (uVar1 != 0) {
    pObj->iFanout = uVar1 - 1;
    if (uVar1 == pObj->nFanouts) {
      if (((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x1) ==
           (undefined1  [24])0x0) && (0xf < *(uint *)pObj)) {
        uVar3 = 0;
        do {
          Frc_ManPlaceDfs_rec(p,(Frc_Obj_t *)
                                ((long)pObj + (long)*(int *)(&pObj[1].field_0x0 + uVar3 * 4) * -4),
                              piPlace);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)pObj >> 4);
      }
      iVar2 = *piPlace;
      *piPlace = iVar2 + 1;
      pObj->pPlace = iVar2;
    }
    return;
  }
  __assert_fail("pObj->iFanout > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                ,800,"void Frc_ManPlaceDfs_rec(Frc_Man_t *, Frc_Obj_t *, int *)");
}

Assistant:

void Frc_ManPlaceDfs_rec( Frc_Man_t * p, Frc_Obj_t * pObj, int * piPlace )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFanin( pObj, pFanin, i )
                Frc_ManPlaceDfs_rec( p, pFanin, piPlace );
        pObj->pPlace = (*piPlace)++;
    }
}